

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall test_ethash_io_memo_file_match::test_method(test_ethash_io_memo_file_match *this)

{
  ethash_h256_t seed_hash;
  ethash_h256_t seedhash;
  uint8_t pv_;
  bool bVar1;
  lazy_ostream *plVar2;
  lazy_ostream *prev;
  ethash_h256_t *in_stack_fffffffffffffd00;
  uint64_t in_stack_fffffffffffffd08;
  undefined8 uVar3;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  ethash_light_t in_stack_fffffffffffffd48;
  uint64_t in_stack_fffffffffffffd50;
  basic_cstring<const_char> *this_00;
  char *in_stack_fffffffffffffd58;
  basic_cstring<const_char> *this_01;
  undefined1 force_create;
  char *s;
  FILE **output_file;
  undefined8 in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  basic_cstring<const_char> *this_02;
  undefined8 in_stack_fffffffffffffd88;
  basic_cstring<const_char> *this_03;
  path *this_04;
  undefined7 in_stack_fffffffffffffd98;
  path local_260;
  basic_cstring<const_char> local_240;
  basic_cstring<const_char> local_230;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_220;
  assertion_result local_200;
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_1d8;
  uint8_t local_1c8 [8];
  char acStack_1c0 [32];
  ethash_io_rc local_1a0 [2];
  basic_cstring<const_char> local_198;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_188;
  basic_cstring<const_char> local_160;
  basic_cstring<const_char> local_150;
  basic_cstring<const_char> local_140;
  basic_cstring<const_char> local_130;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_120;
  path local_f0;
  assertion_result local_d0;
  basic_cstring<const_char> local_b8;
  basic_cstring<const_char> local_a8;
  uint8_t local_98 [8];
  char local_90 [24];
  ethash_full_t local_78;
  ethash_full_t full;
  ethash_light_t light;
  FILE *f;
  ethash_h256_t hash;
  ethash_h256_t seed;
  uint64_t cache_size;
  uint64_t full_size;
  test_ethash_io_memo_file_match *this_local;
  
  builtin_memcpy(hash.b + 0x18,"~~~~~~~~",8);
  builtin_memcpy(seed.b + 0x10,"~~~~~~~~",8);
  f = (FILE *)0x7e7e7e7e587e7e7e;
  builtin_memcpy(hash.b,"~~~~~~~~~~~~~~~~~~~~~~~~",0x18);
  full = (ethash_full_t)
         ethash_light_new_internal(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  local_98[0] = hash.b[0x18];
  local_98[1] = hash.b[0x19];
  local_98[2] = hash.b[0x1a];
  local_98[3] = hash.b[0x1b];
  local_98[4] = hash.b[0x1c];
  local_98[5] = hash.b[0x1d];
  local_98[6] = hash.b[0x1e];
  local_98[7] = hash.b[0x1f];
  builtin_strncpy(local_90,"~~~~~~~~~~~~~~~~~~~~~~~~",0x18);
  seed_hash.b[8] = (char)in_stack_fffffffffffffd78;
  seed_hash.b[9] = (char)((ulong)in_stack_fffffffffffffd78 >> 8);
  seed_hash.b[10] = (char)((ulong)in_stack_fffffffffffffd78 >> 0x10);
  seed_hash.b[0xb] = (char)((ulong)in_stack_fffffffffffffd78 >> 0x18);
  seed_hash.b[0xc] = (char)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  seed_hash.b[0xd] = (char)((ulong)in_stack_fffffffffffffd78 >> 0x28);
  seed_hash.b[0xe] = (char)((ulong)in_stack_fffffffffffffd78 >> 0x30);
  seed_hash.b[0xf] = (char)((ulong)in_stack_fffffffffffffd78 >> 0x38);
  seed_hash.b[0] = (char)in_stack_fffffffffffffd70;
  seed_hash.b[1] = (char)((ulong)in_stack_fffffffffffffd70 >> 8);
  seed_hash.b[2] = (char)((ulong)in_stack_fffffffffffffd70 >> 0x10);
  seed_hash.b[3] = (char)((ulong)in_stack_fffffffffffffd70 >> 0x18);
  seed_hash.b[4] = (char)((ulong)in_stack_fffffffffffffd70 >> 0x20);
  seed_hash.b[5] = (char)((ulong)in_stack_fffffffffffffd70 >> 0x28);
  seed_hash.b[6] = (char)((ulong)in_stack_fffffffffffffd70 >> 0x30);
  seed_hash.b[7] = (char)((ulong)in_stack_fffffffffffffd70 >> 0x38);
  seed_hash.b[0x10] = (char)in_stack_fffffffffffffd80;
  seed_hash.b[0x11] = (char)((ulong)in_stack_fffffffffffffd80 >> 8);
  seed_hash.b[0x12] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x10);
  seed_hash.b[0x13] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x18);
  seed_hash.b[0x14] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  seed_hash.b[0x15] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x28);
  seed_hash.b[0x16] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x30);
  seed_hash.b[0x17] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x38);
  seed_hash.b[0x18] = (char)in_stack_fffffffffffffd88;
  seed_hash.b[0x19] = (char)((ulong)in_stack_fffffffffffffd88 >> 8);
  seed_hash.b[0x1a] = (char)((ulong)in_stack_fffffffffffffd88 >> 0x10);
  seed_hash.b[0x1b] = (char)((ulong)in_stack_fffffffffffffd88 >> 0x18);
  seed_hash.b[0x1c] = (char)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  seed_hash.b[0x1d] = (char)((ulong)in_stack_fffffffffffffd88 >> 0x28);
  seed_hash.b[0x1e] = (char)((ulong)in_stack_fffffffffffffd88 >> 0x30);
  seed_hash.b[0x1f] = (char)((ulong)in_stack_fffffffffffffd88 >> 0x38);
  local_78 = ethash_full_new_internal
                       (in_stack_fffffffffffffd58,seed_hash,in_stack_fffffffffffffd50,
                        in_stack_fffffffffffffd48,
                        (ethash_callback_t)
                        CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  if (local_78 == (ethash_full_t)0x0) {
    __assert_fail("full",
                  "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
                  ,0xfc,"void test_ethash_io_memo_file_match::test_method()");
  }
  do {
    this_02 = &local_a8;
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (this_02,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    this_03 = &local_b8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring(this_03);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,this_02,0xfe,this_03);
    this_04 = &local_f0;
    boost::filesystem::path::path(this_04,"./test_ethash_directory/");
    pv_ = boost::filesystem::is_directory(this_04);
    boost::test_tools::assertion_result::assertion_result(&local_d0,(bool)pv_);
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,"fs::is_directory(fs::path(\"./test_ethash_directory/\"))",0x36);
    boost::unit_test::operator<<(&local_120,plVar2,&local_130);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_d0,&local_120,&local_140,0xfe,2,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_120);
    boost::test_tools::assertion_result::~assertion_result(&local_d0);
    boost::filesystem::path::~path(&local_f0);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ethash_full_delete((ethash_full_t)0x13c231);
  do {
    s = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
    this_00 = &local_150;
    output_file = (FILE **)0x53;
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    this_01 = &local_160;
    boost::unit_test::basic_cstring<const_char>::basic_cstring(this_01);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,this_00,0x105,this_01);
    force_create = (undefined1)((ulong)this_01 >> 0x38);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_188,prev,(char (*) [1])0x15b3a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,s,(unsigned_long)output_file);
    local_1a0[1] = 3;
    builtin_strncpy(acStack_1c0 + 8,"~~~~~~~~~~~~~~~~",0x10);
    local_1c8[0] = hash.b[0x18];
    local_1c8[1] = hash.b[0x19];
    local_1c8[2] = hash.b[0x1a];
    local_1c8[3] = hash.b[0x1b];
    local_1c8[4] = hash.b[0x1c];
    local_1c8[5] = hash.b[0x1d];
    local_1c8[6] = hash.b[0x1e];
    local_1c8[7] = hash.b[0x1f];
    builtin_strncpy(acStack_1c0,"~~~~~~~~",8);
    seedhash.b._8_8_ = this_03;
    seedhash.b._0_8_ = this_02;
    seedhash.b._16_8_ = this_04;
    seedhash.b[0x18] = (char)in_stack_fffffffffffffd98;
    seedhash.b[0x19] = (char)((uint7)in_stack_fffffffffffffd98 >> 8);
    seedhash.b[0x1a] = (char)((uint7)in_stack_fffffffffffffd98 >> 0x10);
    seedhash.b[0x1b] = (char)((uint7)in_stack_fffffffffffffd98 >> 0x18);
    seedhash.b[0x1c] = (char)((uint7)in_stack_fffffffffffffd98 >> 0x20);
    seedhash.b[0x1d] = (char)((uint7)in_stack_fffffffffffffd98 >> 0x28);
    seedhash.b[0x1e] = (char)((uint7)in_stack_fffffffffffffd98 >> 0x30);
    seedhash.b[0x1f] = pv_;
    uVar3 = seed.b._16_8_;
    local_1a0[0] = ethash_io_prepare((char *)plVar2,seedhash,output_file,(uint64_t)s,
                                     (_Bool)force_create);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ethash_io_rc,ethash_io_rc>
              (&local_188,&local_198,0x105,2,2,local_1a0 + 1,"ETHASH_IO_MEMO_MATCH",local_1a0,
               "ethash_io_prepare(\"./test_ethash_directory/\", seed, &f, full_size, false)",uVar3);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_188);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,&local_1d8,0x106,&local_1e8);
    boost::test_tools::assertion_result::assertion_result<_IO_FILE*>(&local_200,(_IO_FILE **)&light)
    ;
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_230,"f",1);
    boost::unit_test::operator<<(&local_220,plVar2,&local_230);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_200,&local_220,&local_240,0x106,2,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_220);
    boost::test_tools::assertion_result::~assertion_result(&local_200);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  fclose((FILE *)light);
  ethash_light_delete((ethash_light_t)0x13c4da);
  boost::filesystem::path::path(&local_260,"./test_ethash_directory/");
  boost::filesystem::remove_all(&local_260);
  boost::filesystem::path::~path(&local_260);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ethash_io_memo_file_match) {
	uint64_t full_size;
	uint64_t cache_size;
	ethash_h256_t seed;
	ethash_h256_t hash;
	FILE* f;
	memcpy(&seed, "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~", 32);
	memcpy(&hash, "~~~X~~~~~~~~~~~~~~~~~~~~~~~~~~~~", 32);

	cache_size = 1024;
	full_size = 1024 * 32;

	ethash_light_t light = ethash_light_new_internal(cache_size, &seed);
	ethash_full_t full = ethash_full_new_internal(
		"./test_ethash_directory/",
		seed,
		full_size,
		light,
		NULL
	);
	BOOST_ASSERT(full);
	// let's make sure that the directory was created
	BOOST_REQUIRE(fs::is_directory(fs::path("./test_ethash_directory/")));
	// delete the full here so that memory is properly unmapped and FILE handler freed
	ethash_full_delete(full);
	// and check that we have a match when checking again
	BOOST_REQUIRE_EQUAL(
		ETHASH_IO_MEMO_MATCH,
		ethash_io_prepare("./test_ethash_directory/", seed, &f, full_size, false)
	);
	BOOST_REQUIRE(f);

	// cleanup
	fclose(f);
	ethash_light_delete(light);
	fs::remove_all("./test_ethash_directory/");
}